

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O2

uint32_t __thiscall Constant::toDot(Constant *this,stringstream *ss)

{
  ostream *poVar1;
  string asStack_38 [32];
  
  poVar1 = std::operator<<((ostream *)(ss + 0x10),'\t');
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = std::operator<<(poVar1,"[shape=box, label=\"Const\\nval: ");
  (**((this->super_Expr).op.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_Token)(asStack_38);
  poVar1 = std::operator<<(poVar1,asStack_38);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1,", fillcolor=\"#f1f8e9\", style=filled]");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(asStack_38);
  return (uint32_t)this;
}

Assistant:

uint32_t toDot(std::stringstream& ss) override {
		uint32_t id = hash(this);
		ss << '\t' << id << ' ' << "[shape=box, label=\"Const\\nval: " << op->toString() << "\"" << ", fillcolor=\"#f1f8e9\", style=filled]" << std::endl;
		return id;
	}